

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

bool ON_WildCardMatchNoCase(wchar_t *s,wchar_t *pattern)

{
  bool bVar1;
  wint_t wVar2;
  wint_t wVar3;
  wchar_t *local_20;
  wchar_t *pattern_local;
  wchar_t *s_local;
  
  if ((pattern == (wchar_t *)0x0) || (*pattern == L'\0')) {
    s_local._7_1_ = true;
    if (s != (wchar_t *)0x0) {
      s_local._7_1_ = *s == L'\0';
    }
  }
  else {
    local_20 = pattern;
    pattern_local = s;
    if (*pattern == L'*') {
      for (local_20 = pattern + 1; *local_20 == L'*'; local_20 = local_20 + 1) {
      }
      if (*local_20 == L'\0') {
        s_local._7_1_ = true;
      }
      else {
        for (; *pattern_local != L'\0'; pattern_local = pattern_local + 1) {
          bVar1 = ON_WildCardMatchNoCase(pattern_local,local_20);
          if (bVar1) {
            return true;
          }
        }
        s_local._7_1_ = false;
      }
    }
    else {
      while (*local_20 != L'*') {
        if (*local_20 == L'?') {
          if (*pattern_local == L'\0') {
            return false;
          }
          local_20 = local_20 + 1;
          pattern_local = pattern_local + 1;
        }
        else {
          if ((*local_20 == L'\\') && ((local_20[1] == L'*' || (local_20[1] == L'?')))) {
            local_20 = local_20 + 1;
          }
          wVar2 = towupper(*local_20);
          wVar3 = towupper(*pattern_local);
          if (wVar2 != wVar3) {
            return false;
          }
          if (*pattern_local == L'\0') {
            return true;
          }
          local_20 = local_20 + 1;
          pattern_local = pattern_local + 1;
        }
      }
      s_local._7_1_ = ON_WildCardMatchNoCase(pattern_local,local_20);
    }
  }
  return s_local._7_1_;
}

Assistant:

bool ON_WildCardMatchNoCase(const wchar_t* s, const wchar_t* pattern)
{
  if ( !pattern || !pattern[0] ) {
    return ( !s || !s[0] ) ? true : false;
  }

  if ( *pattern == '*' )
  {
    pattern++;
    while ( *pattern == '*' )
      pattern++;

    if ( !pattern[0] )
      return true;

    while (*s) {
      if ( ON_WildCardMatchNoCase(s,pattern) )
        return true;
      s++;
    }

    return false;
  }

  while ( *pattern != '*' )
  {
    if ( *pattern == '?' )
    {
      if ( *s) {
        pattern++;
        s++;
        continue;
      }
      return false;
    }

    if ( *pattern == '\\' )
    {
      switch( pattern[1] )
      {
      case '*':
      case '?':
        pattern++;
        break;
      }
    }
    if ( towupper(*pattern) != towupper(*s) )
    {
      return false;
    }

    if ( *s == 0 )
      return true;

    pattern++;
    s++;
  }

  return ON_WildCardMatchNoCase(s,pattern);
}